

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_util_assertion.hpp
# Opt level: O3

AssertionResult * __thiscall
iuutil::MatchesRegexEqHelper::Assertion<char_const*,char_const*>
          (AssertionResult *__return_storage_ptr__,MatchesRegexEqHelper *this,char *regex_str,
          char *actual_str,char **regex,char **actual)

{
  _AutomatonPtr *p_Var1;
  _AutomatonPtr *expected_expression;
  bool bVar2;
  char **v;
  char **v_00;
  string expected_str;
  _AutomatonPtr *local_b0 [2];
  _AutomatonPtr local_a0;
  _Alloc_hider local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  string local_70;
  string local_50;
  
  iutest::detail::iuRegex::iuRegex((iuRegex *)local_b0,*(char **)actual_str);
  if (*regex == (char *)0x0) {
    bVar2 = false;
  }
  else {
    bVar2 = iutest::internal::RE::FullMatch(*regex,(RE *)local_b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)((long)&((iuRegex *)local_b0)->m_pattern + 0x10U)) {
    operator_delete(local_90._M_p,local_80._M_allocated_capacity + 1);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_b0);
  if (bVar2 == false) {
    p_Var1 = (_AutomatonPtr *)((long)&((iuRegex *)local_b0)->m_re + 0x10);
    local_b0[0] = p_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"Matches Regex (","");
    std::__cxx11::string::append((char *)local_b0);
    std::__cxx11::string::append((char *)local_b0);
    expected_expression = local_b0[0];
    iutest::PrintToString<char_const*>(&local_50,(iutest *)actual_str,v);
    iutest::PrintToString<char_const*>(&local_70,(iutest *)regex,v_00);
    iutest::internal::EqFailure
              (__return_storage_ptr__,(char *)expected_expression,regex_str,&local_50,&local_70,
               false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (local_b0[0] != p_Var1) {
      operator_delete(local_b0[0],
                      (ulong)((long)&((local_a0.
                                       super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->super__NFA_base)._M_paren_stack.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 1));
    }
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  return __return_storage_ptr__;
}

Assistant:

inline ::iutest::AssertionResult IUTEST_ATTRIBUTE_UNUSED_ Assertion(const char* regex_str, const char* actual_str
    , const T1& regex, const T2& actual)
{
    if( Compare(regex, actual) )
    {
        return ::iutest::AssertionSuccess();
    }
    ::std::string expected_str = "Matches Regex (";
    expected_str += regex_str;
    expected_str += ")";

    return ::iutest::internal::EqFailure(expected_str.c_str(), actual_str
        , ::iutest::PrintToString(regex)
        , ::iutest::PrintToString(actual)
        , false);
}